

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msh2osh.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  undefined8 uVar1;
  long in_RSI;
  int in_EDI;
  CommPtr world;
  Library lib;
  Mesh mesh;
  int local_4ac;
  long *local_4a8 [2];
  long local_498 [2];
  long local_488;
  undefined8 local_480;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_478;
  undefined8 local_470;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_468;
  Library local_460;
  Mesh local_3f0 [984];
  
  local_460.timers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_460.timers._M_t._M_impl.super__Rb_tree_header._M_header;
  local_460.timers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_460.timers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_460.argv_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_460.argv_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_460.argv_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_460.world_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_460.world_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_460.self_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_460.self_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_460.timers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4ac = in_EDI;
  local_488 = in_RSI;
  local_460.timers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_460.timers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Omega_h::Library::initialize
            ((char *)&local_460,(int *)"9.34.13-sha.dc235450+00000010000000001",(char ***)&local_4ac
            );
  if (local_4ac == 3) {
    Omega_h::Library::world();
    Omega_h::filesystem::path::path((path *)local_4a8,*(char **)(local_488 + 8));
    local_480 = local_470;
    local_478 = local_468;
    if (local_468 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(local_468 + 8) = *(int *)(local_468 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(local_468 + 8) = *(int *)(local_468 + 8) + 1;
      }
    }
    Omega_h::gmsh::read(local_3f0,local_4a8,&local_480);
    if (local_478 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_478);
    }
    if (local_4a8[0] != local_498) {
      operator_delete(local_4a8[0],local_498[0] + 1);
    }
    Omega_h::filesystem::path::path((path *)local_4a8,*(char **)(local_488 + 0x10));
    Omega_h::binary::write((path *)local_4a8,local_3f0);
    if (local_4a8[0] != local_498) {
      operator_delete(local_4a8[0],local_498[0] + 1);
    }
    Omega_h::Mesh::~Mesh(local_3f0);
    if (local_468 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_468);
    }
    Omega_h::Library::~Library(&local_460);
    return 0;
  }
  uVar1 = Omega_h::fail("assertion %s failed at %s +%d\n","argc == 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/msh2osh.cpp"
                        ,5);
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_4a8[0] != &local_460.argv_) {
    operator_delete(local_4a8[0],local_498[0] + 1);
  }
  Omega_h::Mesh::~Mesh(local_3f0);
  if (local_468 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_468);
  }
  Omega_h::Library::~Library(&local_460);
  _Unwind_Resume(uVar1);
}

Assistant:

int main(int argc, char** argv) {
  auto lib = Omega_h::Library(&argc, &argv);
  OMEGA_H_CHECK(argc == 3);
  auto world = lib.world();
  auto mesh = Omega_h::gmsh::read(argv[1], world);
  Omega_h::binary::write(argv[2], &mesh);
}